

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_ALG_SIG_SCHEME_Unmarshal
                 (TPMI_ALG_SIG_SCHEME *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  ushort uVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT16_Unmarshal(target,buffer,size);
  if (TVar2 == 0) {
    uVar1 = *target;
    TVar2 = 0x92;
    if ((uVar1 < 0x1d) &&
       (((0x15500020U >> (uVar1 & 0x1f) & 1) != 0 || ((uVar1 == 0x10 && (flag != 0)))))) {
      TVar2 = 0;
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMI_ALG_SIG_SCHEME_Unmarshal(TPMI_ALG_SIG_SCHEME *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_ECDAA
        case TPM_ALG_ECDAA:
#endif // ALG_ECDAA
#if         ALG_RSASSA
        case TPM_ALG_RSASSA:
#endif // ALG_RSASSA
#if         ALG_RSAPSS
        case TPM_ALG_RSAPSS:
#endif // ALG_RSAPSS
#if         ALG_ECDSA
        case TPM_ALG_ECDSA:
#endif // ALG_ECDSA
#if         ALG_SM2
        case TPM_ALG_SM2:
#endif // ALG_SM2
#if         ALG_ECSCHNORR
        case TPM_ALG_ECSCHNORR:
#endif // ALG_ECSCHNORR
#if         ALG_HMAC
        case TPM_ALG_HMAC:
#endif // ALG_HMAC
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_SCHEME;
        default:
            return TPM_RC_SCHEME;
    }
    return TPM_RC_SUCCESS;
}